

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryReader::read<std::__cxx11::string,std::shared_ptr<pbrt::Texture>>
          (BinaryReader *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
          *result)

{
  mapped_type *this_00;
  size_t in_RCX;
  void *__buf;
  BinaryReader *in_RDI;
  shared_ptr<pbrt::Texture> t2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t1;
  int i;
  int32_t size;
  shared_ptr<pbrt::Texture> *in_stack_ffffffffffffff88;
  BinaryReader *in_stack_ffffffffffffff90;
  shared_ptr<pbrt::Texture> *in_stack_ffffffffffffffa8;
  BinaryReader *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *in_stack_ffffffffffffffd0;
  int local_18;
  int local_14;
  
  read<int,void>(in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
           *)0x22a80c);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
    std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x22a83b);
    read(in_RDI,(int)(string *)&stack0xffffffffffffffc8,__buf,in_RCX);
    read<pbrt::Texture>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
              ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::shared_ptr<pbrt::Texture>::operator=(this_00,in_stack_ffffffffffffff88);
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x22a88c);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void read(std::map<T1,T2> &result)
    {
      int32_t size;
      read(size);
      result.clear();
      for (int i=0;i<size;i++) {
        T1 t1; T2 t2;
        read(t1);
        read(t2);
        result[t1] = t2;
      }
    }